

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::TestParsingMerge_RepeatedGroup::~TestParsingMerge_RepeatedGroup
          (TestParsingMerge_RepeatedGroup *this)

{
  TestParsingMerge_RepeatedGroup *this_local;
  
  ~TestParsingMerge_RepeatedGroup(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestParsingMerge_RepeatedGroup::~TestParsingMerge_RepeatedGroup() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestParsingMerge.RepeatedGroup)
  SharedDtor(*this);
}